

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

uint luai_makeseed(void)

{
  char *b;
  time_t t;
  uint i;
  uint res;
  uint buff [4];
  
  buff._0_8_ = time((time_t *)0x0);
  i = (uint)&i;
  memset(buff + 2,0,0);
  t._4_4_ = i;
  for (t._0_4_ = 1; (uint)t < 4; t._0_4_ = (uint)t + 1) {
    t._4_4_ = (t._4_4_ >> 3) + t._4_4_ * 0x80 + (&i)[(uint)t] ^ t._4_4_;
  }
  return t._4_4_;
}

Assistant:

static unsigned int luai_makeseed (void) {
  unsigned int buff[BUFSEED];
  unsigned int res;
  unsigned int i;
  time_t t = time(NULL);
  char *b = (char*)buff;
  addbuff(b, b);  /* local variable's address */
  addbuff(b, t);  /* time */
  /* fill (rare but possible) remain of the buffer with zeros */
  memset(b, 0, sizeof(buff) - BUFSEEDB);
  res = buff[0];
  for (i = 1; i < BUFSEED; i++)
    res ^= (res >> 3) + (res << 7) + buff[i];
  return res;
}